

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::clear
          (array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_> *this)

{
  CCommand *pCVar1;
  
  if (this->list != (CCommand *)0x0) {
    operator_delete__(this->list);
  }
  this->list_size = 1;
  pCVar1 = (CCommand *)operator_new__(0xa0);
  pCVar1->m_aName[0] = '\0';
  pCVar1->m_aHelpText[0] = '\0';
  pCVar1->m_aArgsFormat[0] = '\0';
  pCVar1->m_pfnCallback = (FCommandCallback)0x0;
  pCVar1->m_pContext = (void *)0x0;
  this->list = pCVar1;
  this->num_elements = 0;
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}